

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedFixed<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  LongSooRep *pLVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  void *pvVar8;
  RepeatedField<unsigned_long> *this;
  int *piVar9;
  RepeatedField<unsigned_int> *this_00;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  ulong uVar10;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar11;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  long *plVar12;
  uint64_t *puVar13;
  uint64_t *puVar14;
  uint *puVar15;
  uint *puVar16;
  uint uVar17;
  Arena *pAVar18;
  bool bVar19;
  uint uVar20;
  bool bVar22;
  pair<const_char_*,_unsigned_int> pVar23;
  LogMessageFatal local_40;
  uint uVar21;
  
  puVar15 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar15 & 3) != 0) {
    AlignFail(puVar15);
  }
  uVar21 = data.field_0._0_4_;
  uVar20 = uVar21 & 7;
  if (uVar20 == 2) {
    pcVar7 = MpPackedFixed<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  pvVar8 = MaybeGetSplitBase(msg,true,table);
  uVar17 = *(ushort *)((long)puVar15 + 10) & 0x1c0;
  if ((ulong)uVar17 == 0xc0) {
    if (uVar20 != 1) {
LAB_0022b363:
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_0022b37a;
    }
    plVar12 = (long *)((long)pvVar8 + (ulong)*puVar15);
    if (((ulong)plVar12 & 7) != 0) {
LAB_0022b47e:
      AlignFail(plVar12);
    }
    if ((undefined1 *)*plVar12 == kZeroBuffer) {
      pAVar18 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar18 & 1) != 0) {
        pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
      }
      if (pAVar18 == (Arena *)0x0) {
        this = (RepeatedField<unsigned_long> *)operator_new(0x10);
        RepeatedField<unsigned_long>::RepeatedField(this,(Arena *)0x0);
      }
      else {
        pvVar8 = Arena::Allocate(pAVar18,0x10);
        local_40.super_LogMessage._0_8_ = pAVar18;
        this = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
               Construct<google::protobuf::Arena*>(pvVar8,(Arena **)&local_40);
      }
      *plVar12 = (long)this;
    }
    pLVar3 = (LongSooRep *)*plVar12;
    puVar13 = (uint64_t *)ptr;
    do {
      aVar11.data = *puVar13;
      uVar10 = pLVar3->elements_int;
      bVar22 = (uVar10 & 4) == 0;
      iVar5 = SooRep::size((SooRep *)pLVar3,bVar22);
      iVar6 = 1;
      if ((pLVar3->elements_int & 4) != 0) {
        iVar6 = pLVar3->capacity;
      }
      if (iVar5 == iVar6) {
        RepeatedField<unsigned_long>::Grow
                  ((RepeatedField<unsigned_long> *)pLVar3,(uVar10 & 4) == 0,iVar5,iVar5 + 1);
      }
      bVar4 = iVar5 != iVar6;
      bVar19 = bVar4 && bVar22;
      piVar9 = &pLVar3->size;
      if (!bVar4 || !bVar22) {
        piVar9 = (int *)LongSooRep::elements(pLVar3);
      }
      iVar6 = SooRep::size((SooRep *)pLVar3,bVar19);
      if ((iVar6 != iVar5 + 1) && ((pLVar3->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar3);
      }
      pcVar7 = (char *)(ulong)bVar19;
      RepeatedField<unsigned_long>::set_size
                ((RepeatedField<unsigned_long> *)pLVar3,bVar19,iVar5 + 1);
      ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(piVar9 + (long)iVar6 * 2))->data =
           (uint64_t)aVar11;
      ptr = (char *)(puVar13 + 1);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
        iVar6 = 4;
        ctx_00 = extraout_RDX;
        goto LAB_0022b391;
      }
      bVar1 = (byte)puVar13[1];
      puVar14 = (uint64_t *)((long)puVar13 + 9);
      ctx_00 = (ParseContext *)(ulong)bVar1;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)puVar14;
        aVar11.data = (ulong)bVar2 << 7;
        uVar20 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        ctx_00 = (ParseContext *)(ulong)uVar20;
        if ((char)bVar2 < '\0') {
          pcVar7 = (char *)(ulong)uVar20;
          pVar23 = ReadTagFallback(ptr,uVar20);
          ctx_00 = pVar23._8_8_;
          puVar14 = (uint64_t *)pVar23.first;
        }
        else {
          puVar14 = (uint64_t *)((long)puVar13 + 10);
        }
      }
      if (puVar14 == (uint64_t *)0x0) {
        iVar6 = 5;
        goto LAB_0022b391;
      }
      puVar13 = puVar14;
    } while ((uint)ctx_00 == uVar21);
    iVar6 = 0;
LAB_0022b391:
    if (iVar6 != 0) {
      if (iVar6 != 4) goto LAB_0022b41b;
      goto LAB_0022b3e8;
    }
  }
  else {
    if (uVar17 == 0x80) {
      failure_msg = (Nonnull<const_char_*>)0x0;
    }
    else {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              ((ulong)uVar17,0x80,
                               "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    }
    if (failure_msg != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x7b7,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    if (uVar20 != 5) goto LAB_0022b363;
    plVar12 = (long *)((long)pvVar8 + (ulong)*puVar15);
    if (((ulong)plVar12 & 7) != 0) goto LAB_0022b47e;
    if ((undefined1 *)*plVar12 == kZeroBuffer) {
      pAVar18 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar18 & 1) != 0) {
        pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
      }
      if (pAVar18 == (Arena *)0x0) {
        this_00 = (RepeatedField<unsigned_int> *)operator_new(0x10);
        RepeatedField<unsigned_int>::RepeatedField(this_00,(Arena *)0x0);
      }
      else {
        pvVar8 = Arena::Allocate(pAVar18,0x10);
        local_40.super_LogMessage._0_8_ = pAVar18;
        this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
                  Construct<google::protobuf::Arena*>(pvVar8,(Arena **)&local_40);
      }
      *plVar12 = (long)this_00;
    }
    pLVar3 = (LongSooRep *)*plVar12;
    puVar15 = (uint *)ptr;
    do {
      uVar20 = *puVar15;
      uVar10 = pLVar3->elements_int;
      bVar22 = (uVar10 & 4) == 0;
      iVar5 = SooRep::size((SooRep *)pLVar3,bVar22);
      iVar6 = 2;
      if ((pLVar3->elements_int & 4) != 0) {
        iVar6 = pLVar3->capacity;
      }
      if (iVar5 == iVar6) {
        RepeatedField<unsigned_int>::Grow
                  ((RepeatedField<unsigned_int> *)pLVar3,(uVar10 & 4) == 0,iVar5,iVar5 + 1);
      }
      bVar4 = iVar5 != iVar6;
      bVar19 = bVar4 && bVar22;
      piVar9 = &pLVar3->size;
      if (!bVar4 || !bVar22) {
        piVar9 = (int *)LongSooRep::elements(pLVar3);
      }
      iVar6 = SooRep::size((SooRep *)pLVar3,bVar19);
      if ((iVar6 != iVar5 + 1) && ((pLVar3->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar3);
      }
      pcVar7 = (char *)(ulong)bVar19;
      RepeatedField<unsigned_int>::set_size((RepeatedField<unsigned_int> *)pLVar3,bVar19,iVar5 + 1);
      aVar11.data._4_4_ = 0;
      aVar11.data._0_4_ = uVar20;
      piVar9[iVar6] = uVar20;
      ptr = (char *)(puVar15 + 1);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
        iVar6 = 4;
        ctx_00 = extraout_RDX_00;
        goto LAB_0022b3a2;
      }
      bVar1 = (byte)puVar15[1];
      puVar16 = (uint *)((long)puVar15 + 5);
      ctx_00 = (ParseContext *)(ulong)bVar1;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)puVar16;
        aVar11.data = (ulong)bVar2 << 7;
        uVar20 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        ctx_00 = (ParseContext *)(ulong)uVar20;
        if ((char)bVar2 < '\0') {
          pcVar7 = (char *)(ulong)uVar20;
          pVar23 = ReadTagFallback(ptr,uVar20);
          ctx_00 = pVar23._8_8_;
          puVar16 = (uint *)pVar23.first;
        }
        else {
          puVar16 = (uint *)((long)puVar15 + 6);
        }
      }
      if (puVar16 == (uint *)0x0) {
        iVar6 = 5;
        goto LAB_0022b3a2;
      }
      puVar15 = puVar16;
    } while ((uint)ctx_00 == uVar21);
    iVar6 = 0;
LAB_0022b3a2:
    if (iVar6 == 5) {
LAB_0022b41b:
      pcVar7 = Error(msg,pcVar7,ctx_00,(TcFieldData)aVar11,table,hasbits);
      return pcVar7;
    }
    if (iVar6 == 4) goto LAB_0022b3e8;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_0022b3e8:
    if ((ulong)table->has_bits_offset != 0) {
      puVar15 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar15 & 3) != 0) {
        AlignFail();
      }
      *puVar15 = *puVar15 | (uint)hasbits;
    }
    return (char *)(uint64_t *)ptr;
  }
  uVar20 = (uint)table->fast_idx_mask & (uint)(ushort)*(uint64_t *)ptr;
  if ((uVar20 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar10 = (ulong)(uVar20 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)(ushort)*(uint64_t *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar10 * 2)
                 );
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar10);
LAB_0022b37a:
  pcVar7 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar7;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedFixed(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  const uint16_t type_card = entry.type_card;
  const uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint64_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint64_t>(ptr);
      ptr += size;
      if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint32_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint32_t>(ptr);
      ptr += size;
      if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}